

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_solid_source(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (const_alpha == 0xff) {
    plutovg_memfill32(dest,length,color);
    return;
  }
  uVar1 = BYTE_MUL(color,const_alpha);
  uVar4 = 0;
  uVar3 = (ulong)(uint)length;
  if (length < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar2 = BYTE_MUL(dest[uVar4],0xff - const_alpha);
    dest[uVar4] = uVar2 + uVar1;
  }
  return;
}

Assistant:

static void composition_solid_source(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        plutovg_memfill32(dest, length, color);
    } else {
        uint32_t ialpha = 255 - const_alpha;
        color = BYTE_MUL(color, const_alpha);
        for(int i = 0; i < length; i++) {
            dest[i] = color + BYTE_MUL(dest[i], ialpha);
        }
    }
}